

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprFor * AnalyzeForEach(ExpressionContext *ctx,SynForEach *syntax)

{
  uint uVar1;
  ModuleData *pMVar2;
  SynIdentifier *pSVar3;
  TypeBase *pTVar4;
  ScopeData *scopeData;
  ExprBase *pEVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ExprDereference *node;
  SynBase *pSVar11;
  ExprBase *pEVar12;
  undefined4 extraout_var;
  TypeRef *pTVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar14;
  undefined4 extraout_var_02;
  _func_int **pp_Var15;
  VariableData *pVVar16;
  ExprBase *pEVar17;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ExprBase *pEVar18;
  VariableData *pVVar19;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  VariableData **ppVVar20;
  undefined4 extraout_var_27;
  ExprBase *pEVar21;
  undefined4 extraout_var_28;
  ExprBase *pEVar22;
  FunctionData *onwerFunction;
  ExprFor *pEVar23;
  uint i;
  uint uVar24;
  ExpressionContext *pEVar25;
  IntrusiveList<ExprBase> *pIVar26;
  ExprBase *in_R8;
  TypeBase *pTVar27;
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  InplaceStr name_05;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr name_06;
  InplaceStr name_07;
  TypeBase *local_168;
  IntrusiveList<ExprBase> initializers;
  VariableData *variable;
  IntrusiveList<ExprBase> definitions;
  IntrusiveList<ExprBase> conditions;
  SmallArray<ArgumentData,_1U> arguments;
  IntrusiveList<ExprBase> increments;
  ArgumentData local_98;
  SmallArray<VariableData_*,_4U> iterators;
  VariableHandle *variable_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_08;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  
  ExpressionContext::PushLoopScope(ctx,true,true);
  initializers.head = (ExprBase *)0x0;
  initializers.tail = (ExprBase *)0x0;
  conditions.head = (ExprBase *)0x0;
  conditions.tail = (ExprBase *)0x0;
  definitions.head = (ExprBase *)0x0;
  definitions.tail = (ExprBase *)0x0;
  increments.head = (ExprBase *)0x0;
  increments.tail = (ExprBase *)0x0;
  iterators.allocator = ctx->allocator;
  iterators.data = iterators.little;
  iterators.count = 0;
  iterators.max = 4;
  pEVar25 = (ExpressionContext *)(syntax->iterators).head;
  do {
    if (pEVar25 == (ExpressionContext *)0x0) {
      for (uVar24 = 0; uVar24 < iterators.count; uVar24 = uVar24 + 1) {
        ppVVar20 = SmallArray<VariableData_*,_4U>::operator[](&iterators,uVar24);
        ExpressionContext::AddVariable(ctx,*ppVVar20,true);
      }
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar17 = (ExprBase *)CONCAT44(extraout_var_27,iVar8);
      pTVar27 = ctx->typeVoid;
      pEVar17->typeID = 0x36;
      pEVar17->source = &syntax->super_SynBase;
      pEVar17->type = pTVar27;
      pEVar17->next = (ExprBase *)0x0;
      pEVar17->listed = false;
      pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002410a0;
      *(undefined4 *)&pEVar17[1]._vptr_ExprBase = initializers.head._0_4_;
      *(undefined4 *)((long)&pEVar17[1]._vptr_ExprBase + 4) = initializers.head._4_4_;
      pEVar17[1].typeID = (uint)initializers.tail;
      *(undefined4 *)&pEVar17[1].field_0xc = initializers.tail._4_4_;
      pEVar17[1].source = (SynBase *)0x0;
      pIVar26 = &conditions;
      pEVar12 = (ExprBase *)0x0;
      while (pEVar18 = pIVar26->head, pEVar18 != (ExprBase *)0x0) {
        pEVar21 = pEVar18;
        if (pEVar12 != (ExprBase *)0x0) {
          pEVar21 = CreateBinaryOp(ctx,&syntax->super_SynBase,SYN_BINARY_OP_LOGICAL_AND,pEVar12,
                                   pEVar18);
        }
        pEVar12 = pEVar21;
        pIVar26 = (IntrusiveList<ExprBase> *)&pEVar18->next;
      }
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar18 = (ExprBase *)CONCAT44(extraout_var_28,iVar8);
      pTVar27 = ctx->typeVoid;
      pEVar18->typeID = 0x36;
      pEVar18->source = &syntax->super_SynBase;
      pEVar18->type = pTVar27;
      pEVar18->next = (ExprBase *)0x0;
      pEVar18->listed = false;
      pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002410a0;
      *(undefined4 *)&pEVar18[1]._vptr_ExprBase = increments.head._0_4_;
      *(undefined4 *)((long)&pEVar18[1]._vptr_ExprBase + 4) = increments.head._4_4_;
      pEVar18[1].typeID = (uint)increments.tail;
      *(undefined4 *)&pEVar18[1].field_0xc = increments.tail._4_4_;
      pEVar18[1].source = (SynBase *)0x0;
      if (syntax->body != (SynBase *)0x0) {
        pEVar21 = AnalyzeStatement(ctx,syntax->body);
        IntrusiveList<ExprBase>::push_back(&definitions,pEVar21);
      }
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar5 = definitions.tail;
      pEVar21 = definitions.head;
      pEVar22 = (ExprBase *)CONCAT44(extraout_var_29,iVar8);
      pTVar27 = ctx->typeVoid;
      pEVar25 = ctx;
      pSVar11 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      scopeData = ctx->scope;
      onwerFunction = ExpressionContext::GetCurrentFunction(pEVar25,scopeData);
      pSVar11 = (SynBase *)CreateBlockUpvalueClose(ctx,pSVar11,onwerFunction,scopeData);
      pEVar22->typeID = 0x36;
      pEVar22->source = &syntax->super_SynBase;
      pEVar22->type = pTVar27;
      pEVar22->next = (ExprBase *)0x0;
      pEVar22->listed = false;
      pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002410a0;
      pEVar22[1]._vptr_ExprBase = (_func_int **)pEVar21;
      *(ExprBase **)&pEVar22[1].typeID = pEVar5;
      pEVar22[1].source = pSVar11;
      ExpressionContext::PopScope(ctx,SCOPE_LOOP);
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pEVar23 = (ExprFor *)CONCAT44(extraout_var_30,iVar8);
      pTVar27 = ctx->typeVoid;
      (pEVar23->super_ExprBase).typeID = 0x30;
      (pEVar23->super_ExprBase).source = &syntax->super_SynBase;
      (pEVar23->super_ExprBase).type = pTVar27;
      (pEVar23->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar23->super_ExprBase).listed = false;
      (pEVar23->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002412d0;
      pEVar23->initializer = pEVar17;
      pEVar23->condition = pEVar12;
      pEVar23->increment = pEVar18;
      pEVar23->body = pEVar22;
      SmallArray<VariableData_*,_4U>::~SmallArray(&iterators);
      return pEVar23;
    }
    pSVar11 = &ExpressionContext::MakeInternal(ctx,(SynBase *)pEVar25)->super_SynBase;
    pEVar12 = AnalyzeExpression(ctx,(SynBase *)(pEVar25->uniqueDependencies).little[4]);
    if ((pEVar12->type == (TypeBase *)0x0) || (pEVar12->type->typeID != 0)) {
      pMVar2 = (pEVar25->uniqueDependencies).little[2];
      bVar7 = true;
      if ((pMVar2 == (ModuleData *)0x0) ||
         (local_168 = AnalyzeType(ctx,(SynBase *)pMVar2,true,(bool *)0x0),
         local_168 == (TypeBase *)0x0)) {
        local_168 = (TypeBase *)0x0;
      }
      else {
        if (local_168->typeID == 0) goto LAB_00173e37;
        bVar7 = false;
      }
      pTVar27 = pEVar12->type;
      if (pTVar27 == (TypeBase *)0x0) {
LAB_00173d56:
        bVar6 = AssertValueExpression(ctx,(SynBase *)pEVar25,pEVar12);
        if (!bVar6) goto LAB_00173e37;
        pTVar27 = pEVar12->type;
        if ((pTVar27 == (TypeBase *)0x0) || (pEVar17 = pEVar12, pTVar27->typeID != 0x15)) {
          pMVar2 = (pEVar25->uniqueDependencies).little[4];
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          name.end = "";
          name.begin = "start";
          SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_01,iVar8),name);
          pEVar17 = CreateMemberAccess(ctx,(SynBase *)pMVar2,pEVar12,
                                       (SynIdentifier *)CONCAT44(extraout_var_01,iVar8),false);
          in_R8 = (ExprBase *)0x0;
          pEVar17 = CreateFunctionCall(ctx,pSVar11,pEVar17,(IntrusiveList<TypeHandle>)ZEXT816(0),
                                       (SynCallArgument *)0x0,false);
          pTVar27 = pEVar17->type;
          if (pTVar27 != (TypeBase *)0x0) {
            if (pTVar27->typeID == 0x15) goto LAB_001746c5;
            if (pTVar27->typeID == 0) goto LAB_00173e37;
          }
          pVVar16 = anon_unknown.dwarf_b837c::AllocateTemporary(ctx,pSVar11,pTVar27);
          pEVar12 = CreateVariableAccess(ctx,pSVar11,pVVar16,false);
          pEVar12 = CreateAssignment(ctx,pSVar11,pEVar12,pEVar17);
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar17 = (ExprBase *)CONCAT44(extraout_var_12,iVar8);
          pTVar27 = ctx->typeVoid;
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var15 = (_func_int **)CONCAT44(extraout_var_13,iVar8);
          *pp_Var15 = (_func_int *)0x0;
          pp_Var15[1] = (_func_int *)pVVar16;
          pp_Var15[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var15 + 3) = 0;
          pEVar17->typeID = 0x1e;
          pEVar17->source = pSVar11;
          pEVar17->type = pTVar27;
          pEVar17->next = (ExprBase *)0x0;
          pEVar17->listed = false;
          pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
          pEVar17[1]._vptr_ExprBase = pp_Var15;
          *(ExprBase **)&pEVar17[1].typeID = pEVar12;
          IntrusiveList<ExprBase>::push_back(&initializers,pEVar17);
          pEVar12 = CreateVariableAccess(ctx,pSVar11,pVVar16,false);
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          name_01.end = "";
          name_01.begin = "hasnext";
          SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_14,iVar8),name_01);
          pEVar12 = CreateMemberAccess(ctx,pSVar11,pEVar12,
                                       (SynIdentifier *)CONCAT44(extraout_var_14,iVar8),false);
          pEVar12 = CreateFunctionCall(ctx,(SynBase *)pEVar25,pEVar12,
                                       (IntrusiveList<TypeHandle>)ZEXT816(0),(SynCallArgument *)0x0,
                                       false);
          IntrusiveList<ExprBase>::push_back(&conditions,pEVar12);
          pEVar12 = CreateVariableAccess(ctx,pSVar11,pVVar16,false);
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          name_02.end = "";
          name_02.begin = "next";
          SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_15,iVar8),name_02);
          pEVar12 = CreateMemberAccess(ctx,pSVar11,pEVar12,
                                       (SynIdentifier *)CONCAT44(extraout_var_15,iVar8),false);
          in_R8 = (ExprBase *)0x0;
          pEVar17 = CreateFunctionCall(ctx,(SynBase *)pEVar25,pEVar12,
                                       (IntrusiveList<TypeHandle>)ZEXT816(0),(SynCallArgument *)0x0,
                                       false);
          if ((bool)(bVar7 | local_168 == ctx->typeAuto)) {
            pTVar13 = (TypeRef *)pEVar17->type;
          }
          else {
            pTVar13 = ExpressionContext::GetReferenceType(ctx,local_168);
          }
          if ((pTVar13 == (TypeRef *)0x0) || ((pTVar13->super_TypeBase).typeID != 0)) {
            pMVar2 = (pEVar25->uniqueDependencies).little[3];
            name_06.end = (char *)in_R8;
            name_06.begin = (char *)pMVar2[1].source;
            anon_unknown.dwarf_b837c::CheckVariableConflict
                      ((anon_unknown_dwarf_b837c *)ctx,pEVar25,
                       *(SynBase **)&pMVar2->importedFunctionCount,name_06);
            uVar10 = anon_unknown.dwarf_b837c::AllocateVariableInScope
                               (ctx,(SynBase *)pEVar25,(pTVar13->super_TypeBase).alignment,
                                &pTVar13->super_TypeBase);
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
            pVVar16 = (VariableData *)CONCAT44(extraout_var_16,iVar8);
            uVar24 = (pTVar13->super_TypeBase).alignment;
            in_R8 = (ExprBase *)(ulong)uVar24;
            pSVar3 = (SynIdentifier *)(pEVar25->uniqueDependencies).little[3];
            uVar1 = ctx->uniqueVariableId;
            ctx->uniqueVariableId = uVar1 + 1;
            VariableData::VariableData
                      (pVVar16,ctx->allocator,(SynBase *)pEVar25,ctx->scope,uVar24,
                       &pTVar13->super_TypeBase,pSVar3,uVar10,uVar1);
            pVVar16->isReference = (pTVar13->super_TypeBase).typeID == 0x12;
            arguments.data = (ArgumentData *)pVVar16;
            bVar7 = anon_unknown.dwarf_b837c::IsLookupOnlyVariable(ctx,pVVar16);
            if (bVar7) {
              pVVar16->lookupOnly = true;
            }
            SmallArray<VariableData_*,_4U>::push_back(&iterators,(VariableData **)&arguments);
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar12 = (ExprBase *)CONCAT44(extraout_var_17,iVar8);
            pTVar27 = ctx->typeVoid;
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pp_Var15 = (_func_int **)CONCAT44(extraout_var_18,iVar8);
            *pp_Var15 = (_func_int *)0x0;
            pp_Var15[1] = (_func_int *)arguments.data;
            pp_Var15[2] = (_func_int *)0x0;
            *(undefined1 *)(pp_Var15 + 3) = 0;
            pEVar18 = CreateVariableAccess(ctx,pSVar11,(VariableData *)arguments.data,false);
            pEVar17 = CreateAssignment(ctx,pSVar11,pEVar18,pEVar17);
            pEVar12->typeID = 0x1e;
            pEVar12->source = (SynBase *)pEVar25;
            pEVar12->type = pTVar27;
            pEVar12->next = (ExprBase *)0x0;
            pEVar12->listed = false;
            pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
            pEVar12[1]._vptr_ExprBase = pp_Var15;
            *(ExprBase **)&pEVar12[1].typeID = pEVar17;
            pIVar26 = &definitions;
            goto LAB_00173e3f;
          }
        }
        else {
LAB_001746c5:
          pVVar16 = anon_unknown.dwarf_b837c::AllocateTemporary(ctx,pSVar11,pTVar27);
          pEVar12 = CreateVariableAccess(ctx,pSVar11,pVVar16,false);
          pEVar12 = CreateAssignment(ctx,pSVar11,pEVar12,pEVar17);
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar18 = (ExprBase *)CONCAT44(extraout_var_19,iVar8);
          pTVar4 = ctx->typeVoid;
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var15 = (_func_int **)CONCAT44(extraout_var_20,iVar8);
          *pp_Var15 = (_func_int *)0x0;
          pp_Var15[1] = (_func_int *)pVVar16;
          pp_Var15[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var15 + 3) = 0;
          pEVar18->typeID = 0x1e;
          pEVar18->source = pSVar11;
          pEVar18->type = pTVar4;
          pEVar18->next = (ExprBase *)0x0;
          pEVar18->listed = false;
          pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
          pEVar18[1]._vptr_ExprBase = pp_Var15;
          *(ExprBase **)&pEVar18[1].typeID = pEVar12;
          IntrusiveList<ExprBase>::push_back(&initializers,pEVar18);
          if (pEVar17->typeID == 0x26) {
            if (*(char *)(pEVar17[1]._vptr_ExprBase + 4) == '\0') {
              anon_unknown.dwarf_b837c::Stop
                        (ctx,(SynBase *)pEVar25,"ERROR: function is not a coroutine");
            }
          }
          else {
            in_R8 = CreateVariableAccess(ctx,pSVar11,pVVar16,false);
            name_03.end = "";
            name_03.begin = "__assertCoroutine";
            pEVar12 = CreateFunctionCall1(ctx,pSVar11,name_03,in_R8,false,true,true);
            IntrusiveList<ExprBase>::push_back(&initializers,pEVar12);
          }
          if (((bool)(bVar7 | local_168 == ctx->typeAuto)) &&
             (local_168 = (TypeBase *)pTVar27[1]._vptr_TypeBase, local_168 == ctx->typeAuto)) {
            anon_unknown.dwarf_b837c::Report
                      (ctx,(SynBase *)pEVar25,"ERROR: function type is unresolved at this point");
          }
          else {
            pMVar2 = (pEVar25->uniqueDependencies).little[3];
            name_07.end = (char *)in_R8;
            name_07.begin = (char *)pMVar2[1].source;
            anon_unknown.dwarf_b837c::CheckVariableConflict
                      ((anon_unknown_dwarf_b837c *)ctx,pEVar25,
                       *(SynBase **)&pMVar2->importedFunctionCount,name_07);
            uVar10 = anon_unknown.dwarf_b837c::AllocateVariableInScope
                               (ctx,(SynBase *)pEVar25,local_168->alignment,local_168);
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
            pVVar19 = (VariableData *)CONCAT44(extraout_var_21,iVar8);
            uVar24 = local_168->alignment;
            pSVar3 = (SynIdentifier *)(pEVar25->uniqueDependencies).little[3];
            uVar1 = ctx->uniqueVariableId;
            ctx->uniqueVariableId = uVar1 + 1;
            VariableData::VariableData
                      (pVVar19,ctx->allocator,(SynBase *)pEVar25,ctx->scope,uVar24,local_168,pSVar3,
                       uVar10,uVar1);
            arguments.data = (ArgumentData *)pVVar19;
            bVar7 = anon_unknown.dwarf_b837c::IsLookupOnlyVariable(ctx,pVVar19);
            if (bVar7) {
              pVVar19->lookupOnly = true;
            }
            SmallArray<VariableData_*,_4U>::push_back(&iterators,(VariableData **)&arguments);
            pEVar12 = CreateVariableAccess(ctx,pSVar11,pVVar16,false);
            pEVar12 = CreateFunctionCall(ctx,(SynBase *)pEVar25,pEVar12,
                                         (IntrusiveList<TypeHandle>)ZEXT816(0),
                                         (SynCallArgument *)0x0,false);
            if (pEVar12 != (ExprBase *)0x0) {
              pTVar13 = ExpressionContext::GetReferenceType(ctx,local_168);
              pEVar17 = pEVar12;
              if (pTVar13 == (TypeRef *)pEVar12->type) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                pEVar17 = (ExprBase *)CONCAT44(extraout_var_22,iVar8);
                pEVar17->typeID = 0x16;
                pEVar17->source = (SynBase *)pEVar25;
                pEVar17->type = local_168;
                pEVar17->next = (ExprBase *)0x0;
                pEVar17->listed = false;
                pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a80;
                pEVar17[1]._vptr_ExprBase = (_func_int **)pEVar12;
              }
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              pEVar12 = (ExprBase *)CONCAT44(extraout_var_23,iVar8);
              pTVar27 = ctx->typeVoid;
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pp_Var15 = (_func_int **)CONCAT44(extraout_var_24,iVar8);
              *pp_Var15 = (_func_int *)0x0;
              pp_Var15[1] = (_func_int *)arguments.data;
              pp_Var15[2] = (_func_int *)0x0;
              *(undefined1 *)(pp_Var15 + 3) = 0;
              pEVar18 = CreateVariableAccess
                                  (ctx,(SynBase *)pEVar25,(VariableData *)arguments.data,false);
              pEVar17 = CreateAssignment(ctx,(SynBase *)pEVar25,pEVar18,pEVar17);
              pEVar12->typeID = 0x1e;
              pEVar12->source = (SynBase *)pEVar25;
              pEVar12->type = pTVar27;
              pEVar12->next = (ExprBase *)0x0;
              pEVar12->listed = false;
              pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
              pEVar12[1]._vptr_ExprBase = pp_Var15;
              *(ExprBase **)&pEVar12[1].typeID = pEVar17;
              IntrusiveList<ExprBase>::push_back(&initializers,pEVar12);
            }
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar12 = (ExprBase *)CONCAT44(extraout_var_25,iVar8);
            pTVar27 = ctx->typeBool;
            pEVar17 = CreateVariableAccess(ctx,pSVar11,pVVar16,false);
            name_04.end = "";
            name_04.begin = "isCoroutineReset";
            pEVar17 = CreateFunctionCall1(ctx,(SynBase *)pEVar25,name_04,pEVar17,false,false,true);
            pEVar12->typeID = 0x13;
            pEVar12->source = (SynBase *)pEVar25;
            pEVar12->type = pTVar27;
            pEVar12->next = (ExprBase *)0x0;
            pEVar12->listed = false;
            pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240d20;
            *(undefined4 *)&pEVar12->field_0x2c = 4;
            pEVar12[1]._vptr_ExprBase = (_func_int **)pEVar17;
            IntrusiveList<ExprBase>::push_back(&conditions,pEVar12);
            pEVar12 = CreateVariableAccess(ctx,pSVar11,pVVar16,false);
            in_R8 = (ExprBase *)0x0;
            pEVar12 = CreateFunctionCall(ctx,(SynBase *)pEVar25,pEVar12,
                                         (IntrusiveList<TypeHandle>)ZEXT816(0),
                                         (SynCallArgument *)0x0,false);
            if (pEVar12 != (ExprBase *)0x0) {
              pTVar13 = ExpressionContext::GetReferenceType(ctx,local_168);
              pEVar17 = pEVar12;
              if (pTVar13 == (TypeRef *)pEVar12->type) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                pEVar17 = (ExprBase *)CONCAT44(extraout_var_26,iVar8);
                pEVar17->typeID = 0x16;
                pEVar17->source = (SynBase *)pEVar25;
                pEVar17->type = local_168;
                pEVar17->next = (ExprBase *)0x0;
                pEVar17->listed = false;
                pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a80;
                pEVar17[1]._vptr_ExprBase = (_func_int **)pEVar12;
              }
              pEVar12 = CreateVariableAccess
                                  (ctx,(SynBase *)pEVar25,(VariableData *)arguments.data,false);
              pEVar12 = CreateAssignment(ctx,(SynBase *)pEVar25,pEVar12,pEVar17);
              pIVar26 = &increments;
              goto LAB_00173e3f;
            }
          }
        }
      }
      else {
        if (pTVar27->typeID == 0x14) {
          lVar14 = 0x88;
          if ((bool)(bVar7 | local_168 == ctx->typeAuto)) {
LAB_00173cd3:
            local_168 = *(TypeBase **)((long)&pTVar27->_vptr_TypeBase + lVar14);
          }
        }
        else {
          if (pTVar27->typeID != 0x13) goto LAB_00173d56;
          lVar14 = 0x60;
          if (bVar7 || local_168 == ctx->typeAuto) goto LAB_00173cd3;
        }
        if (pEVar12->typeID != 0x16) {
          if (pEVar12->typeID == 0x22) {
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pSVar11 = pEVar12->source;
            pTVar13 = ExpressionContext::GetReferenceType(ctx,pEVar12->type);
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            variable_00 = (VariableHandle *)CONCAT44(extraout_var_00,iVar9);
            pVVar16 = (VariableData *)pEVar12[1]._vptr_ExprBase;
            variable_00->source = pEVar12->source;
            variable_00->variable = pVVar16;
            variable_00->next = (VariableHandle *)0x0;
            variable_00->listed = false;
            ExprGetAddress::ExprGetAddress
                      ((ExprGetAddress *)CONCAT44(extraout_var,iVar8),pSVar11,
                       &pTVar13->super_TypeBase,variable_00);
          }
          else {
            pVVar16 = anon_unknown.dwarf_b837c::AllocateTemporary(ctx,pEVar12->source,pTVar27);
            pSVar11 = pEVar12->source;
            pEVar17 = CreateVariableAccess(ctx,pSVar11,pVVar16,false);
            pEVar17 = CreateAssignment(ctx,pSVar11,pEVar17,pEVar12);
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar18 = (ExprBase *)CONCAT44(extraout_var_02,iVar8);
            pSVar11 = pEVar12->source;
            pTVar27 = ctx->typeVoid;
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pp_Var15 = (_func_int **)CONCAT44(extraout_var_03,iVar8);
            *pp_Var15 = (_func_int *)0x0;
            pp_Var15[1] = (_func_int *)pVVar16;
            pp_Var15[2] = (_func_int *)0x0;
            *(undefined1 *)(pp_Var15 + 3) = 0;
            pEVar18->typeID = 0x1e;
            pEVar18->source = pSVar11;
            pEVar18->type = pTVar27;
            pEVar18->next = (ExprBase *)0x0;
            pEVar18->listed = false;
            pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
            pEVar18[1]._vptr_ExprBase = pp_Var15;
            *(ExprBase **)&pEVar18[1].typeID = pEVar17;
            pSVar11 = pEVar12->source;
            pEVar17 = CreateVariableAccess(ctx,pSVar11,pVVar16,false);
            pEVar17 = CreateGetAddress(ctx,pSVar11,pEVar17);
            CreateSequence(ctx,pSVar11,pEVar18,pEVar17);
          }
        }
        pVVar16 = anon_unknown.dwarf_b837c::AllocateTemporary(ctx,(SynBase *)pEVar25,ctx->typeInt);
        pEVar17 = CreateVariableAccess(ctx,(SynBase *)pEVar25,pVVar16,false);
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar18 = (ExprBase *)CONCAT44(extraout_var_04,iVar8);
        pTVar27 = ctx->typeInt;
        pEVar18->typeID = 6;
        pEVar18->source = (SynBase *)pEVar25;
        pEVar18->type = pTVar27;
        pEVar18->next = (ExprBase *)0x0;
        pEVar18->listed = false;
        pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002404e0;
        pEVar18[1]._vptr_ExprBase = (_func_int **)0x0;
        pEVar17 = CreateAssignment(ctx,(SynBase *)pEVar25,pEVar17,pEVar18);
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar18 = (ExprBase *)CONCAT44(extraout_var_05,iVar8);
        pTVar27 = ctx->typeVoid;
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var15 = (_func_int **)CONCAT44(extraout_var_06,iVar8);
        *pp_Var15 = (_func_int *)0x0;
        pp_Var15[1] = (_func_int *)pVVar16;
        pp_Var15[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var15 + 3) = 0;
        pEVar18->typeID = 0x1e;
        pEVar18->source = (SynBase *)pEVar25;
        pEVar18->type = pTVar27;
        pEVar18->next = (ExprBase *)0x0;
        pEVar18->listed = false;
        pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
        pEVar18[1]._vptr_ExprBase = pp_Var15;
        *(ExprBase **)&pEVar18[1].typeID = pEVar17;
        IntrusiveList<ExprBase>::push_back(&initializers,pEVar18);
        pEVar17 = CreateVariableAccess(ctx,(SynBase *)pEVar25,pVVar16,false);
        pMVar2 = (pEVar25->uniqueDependencies).little[4];
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        name_00.end = "";
        name_00.begin = "size";
        SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_07,iVar8),name_00);
        pEVar18 = CreateMemberAccess(ctx,(SynBase *)pMVar2,pEVar12,
                                     (SynIdentifier *)CONCAT44(extraout_var_07,iVar8),false);
        pEVar17 = CreateBinaryOp(ctx,(SynBase *)pEVar25,SYN_BINARY_OP_LESS,pEVar17,pEVar18);
        IntrusiveList<ExprBase>::push_back(&conditions,pEVar17);
        pTVar13 = ExpressionContext::GetReferenceType(ctx,local_168);
        pMVar2 = (pEVar25->uniqueDependencies).little[3];
        name_05.end = (char *)pEVar18;
        name_05.begin = (char *)pMVar2[1].source;
        anon_unknown.dwarf_b837c::CheckVariableConflict
                  ((anon_unknown_dwarf_b837c *)ctx,pEVar25,
                   *(SynBase **)&pMVar2->importedFunctionCount,name_05);
        uVar10 = anon_unknown.dwarf_b837c::AllocateVariableInScope
                           (ctx,(SynBase *)pEVar25,(pTVar13->super_TypeBase).alignment,
                            &pTVar13->super_TypeBase);
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        pVVar19 = (VariableData *)CONCAT44(extraout_var_08,iVar8);
        uVar24 = (pTVar13->super_TypeBase).alignment;
        pSVar3 = (SynIdentifier *)(pEVar25->uniqueDependencies).little[3];
        uVar1 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar1 + 1;
        VariableData::VariableData
                  (pVVar19,ctx->allocator,(SynBase *)pEVar25,ctx->scope,uVar24,
                   &pTVar13->super_TypeBase,pSVar3,uVar10,uVar1);
        pVVar19->isReference = true;
        variable = pVVar19;
        bVar7 = anon_unknown.dwarf_b837c::IsLookupOnlyVariable(ctx,pVVar19);
        if (bVar7) {
          pVVar19->lookupOnly = true;
        }
        SmallArray<VariableData_*,_4U>::push_back(&iterators,&variable);
        arguments.allocator = ctx->allocator;
        arguments.little[0].source = (SynBase *)0x0;
        arguments.little[0].isExplicit = false;
        arguments.data = arguments.little;
        arguments.little[0].value = (ExprBase *)0x0;
        arguments.little[0].valueFunction = (FunctionData *)0x0;
        arguments.little[0].name = (SynIdentifier *)0x0;
        arguments.little[0].type = (TypeBase *)0x0;
        arguments.count = 0;
        arguments.max = 1;
        pTVar27 = ctx->typeInt;
        local_98.value = CreateVariableAccess(ctx,(SynBase *)pEVar25,pVVar16,false);
        local_98.isExplicit = false;
        local_98.name = (SynIdentifier *)0x0;
        local_98.valueFunction = (FunctionData *)0x0;
        local_98.source = (SynBase *)pEVar25;
        local_98.type = pTVar27;
        SmallArray<ArgumentData,_1U>::push_back(&arguments,&local_98);
        arguments_00.count = arguments.count;
        arguments_00.data = arguments.data;
        arguments_00._12_4_ = 0;
        in_R8 = (ExprBase *)(ulong)arguments.count;
        pEVar12 = CreateArrayIndex(ctx,(SynBase *)pEVar25,pEVar12,arguments_00);
        if ((pEVar12 == (ExprBase *)0x0) || (pEVar12->typeID != 0x16)) {
          __assert_fail("isType<ExprDereference>(arrayIndex)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x2c46,"ExprFor *AnalyzeForEach(ExpressionContext &, SynForEach *)");
        }
        pEVar12 = (ExprBase *)pEVar12[1]._vptr_ExprBase;
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar17 = (ExprBase *)CONCAT44(extraout_var_09,iVar8);
        pTVar27 = ctx->typeVoid;
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var15 = (_func_int **)CONCAT44(extraout_var_10,iVar8);
        *pp_Var15 = (_func_int *)0x0;
        pp_Var15[1] = (_func_int *)variable;
        pp_Var15[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var15 + 3) = 0;
        pEVar18 = CreateVariableAccess(ctx,(SynBase *)pEVar25,variable,false);
        pEVar12 = CreateAssignment(ctx,(SynBase *)pEVar25,pEVar18,pEVar12);
        pEVar17->typeID = 0x1e;
        pEVar17->source = (SynBase *)pEVar25;
        pEVar17->type = pTVar27;
        pEVar17->next = (ExprBase *)0x0;
        pEVar17->listed = false;
        pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
        pEVar17[1]._vptr_ExprBase = pp_Var15;
        *(ExprBase **)&pEVar17[1].typeID = pEVar12;
        IntrusiveList<ExprBase>::push_back(&definitions,pEVar17);
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar12 = (ExprBase *)CONCAT44(extraout_var_11,iVar8);
        pTVar27 = ctx->typeInt;
        pEVar17 = CreateVariableAccess(ctx,(SynBase *)pEVar25,pVVar16,false);
        pEVar17 = CreateGetAddress(ctx,(SynBase *)pEVar25,pEVar17);
        pEVar12->typeID = 0x10;
        pEVar12->source = (SynBase *)pEVar25;
        pEVar12->type = pTVar27;
        pEVar12->next = (ExprBase *)0x0;
        pEVar12->listed = false;
        pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240cb0;
        pEVar12[1]._vptr_ExprBase = (_func_int **)pEVar17;
        *(undefined1 *)&pEVar12[1].typeID = 1;
        IntrusiveList<ExprBase>::push_back(&increments,pEVar12);
        SmallArray<ArgumentData,_1U>::~SmallArray(&arguments);
      }
    }
    else {
LAB_00173e37:
      pIVar26 = &initializers;
LAB_00173e3f:
      IntrusiveList<ExprBase>::push_back(pIVar26,pEVar12);
    }
    pEVar25 = (ExpressionContext *)(pEVar25->uniqueDependencies).little[0];
    if ((pEVar25 == (ExpressionContext *)0x0) ||
       (*(int *)&((InplaceStr *)&pEVar25->code)->begin != 0x29)) {
      pEVar25 = (ExpressionContext *)0x0;
    }
  } while( true );
}

Assistant:

ExprFor* AnalyzeForEach(ExpressionContext &ctx, SynForEach *syntax)
{
	ctx.PushLoopScope(true, true);

	IntrusiveList<ExprBase> initializers;
	IntrusiveList<ExprBase> conditions;
	IntrusiveList<ExprBase> definitions;
	IntrusiveList<ExprBase> increments;

	SmallArray<VariableData*, 4> iterators(ctx.allocator);

	for(SynForEachIterator *curr = syntax->iterators.head; curr; curr = getType<SynForEachIterator>(curr->next))
	{
		SynBase *sourceInternal = ctx.MakeInternal(curr);

		ExprBase *value = AnalyzeExpression(ctx, curr->value);

		if(isType<TypeError>(value->type))
		{
			initializers.push_back(value);
			continue;
		}

		TypeBase *type = NULL;

		if(curr->type)
			type = AnalyzeType(ctx, curr->type);

		if(isType<TypeError>(type))
		{
			initializers.push_back(value);
			continue;
		}

		// Special implementation of for each for built-in arrays
		if(isType<TypeArray>(value->type) || isType<TypeUnsizedArray>(value->type))
		{
			if(!type || type == ctx.typeAuto)
			{
				if(TypeArray *valueType = getType<TypeArray>(value->type))
					type = valueType->subType;
				else if(TypeUnsizedArray *valueType = getType<TypeUnsizedArray>(value->type))
					type = valueType->subType;
			}

			ExprBase* wrapped = value;

			if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
			{
				wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(value->source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
			}
			else if(ExprDereference *node = getType<ExprDereference>(value))
			{
				wrapped = node->value;
			}
			else if(!isType<TypeRef>(wrapped->type))
			{
				VariableData *storage = AllocateTemporary(ctx, value->source, wrapped->type);

				ExprBase *assignment = CreateAssignment(ctx, value->source, CreateVariableAccess(ctx, value->source, storage, false), value);

				ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(value->source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

				wrapped = CreateSequence(ctx, value->source, definition, CreateGetAddress(ctx, value->source, CreateVariableAccess(ctx, value->source, storage, false)));
			}

			// Create initializer
			VariableData *iterator = AllocateTemporary(ctx, curr, ctx.typeInt);

			ExprBase *iteratorAssignment = CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, iterator, false), new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(curr, ctx.typeInt, 0));

			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, iterator), iteratorAssignment));

			// Create condition
			conditions.push_back(CreateBinaryOp(ctx, curr, SYN_BINARY_OP_LESS, CreateVariableAccess(ctx, curr, iterator, false), CreateMemberAccess(ctx, curr->value, value, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("size")), false)));

			// Create definition
			type = ctx.GetReferenceType(type);

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			variable->isReference = true;

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			SmallArray<ArgumentData, 1> arguments(ctx.allocator);
			arguments.push_back(ArgumentData(curr, false, NULL, ctx.typeInt, CreateVariableAccess(ctx, curr, iterator, false)));

			ExprBase *arrayIndex = CreateArrayIndex(ctx, curr, value, arguments);

			assert(isType<ExprDereference>(arrayIndex));

			if(ExprDereference *node = getType<ExprDereference>(arrayIndex))
				arrayIndex = node->value;

			definitions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), arrayIndex)));

			// Create increment
			increments.push_back(new (ctx.get<ExprPreModify>()) ExprPreModify(curr, ctx.typeInt, CreateGetAddress(ctx, curr, CreateVariableAccess(ctx, curr, iterator, false)), true));
			continue;
		}

		if(!AssertValueExpression(ctx, curr, value))
		{
			initializers.push_back(value);
			continue;
		}

		TypeFunction *functionType = getType<TypeFunction>(value->type);
		ExprBase *startCall = NULL;
		
		// If we don't have a function, get an iterator
		if(!functionType)
		{
			startCall = CreateFunctionCall(ctx, sourceInternal, CreateMemberAccess(ctx, curr->value, value, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("start")), false), IntrusiveList<TypeHandle>(), NULL, false);

			if(isType<TypeError>(startCall->type))
			{
				initializers.push_back(value);
				continue;
			}

			// Check if iteartor is a coroutine
			functionType = getType<TypeFunction>(startCall->type);

			if(functionType)
				value = startCall;
		}

		if(functionType)
		{
			// Store function pointer in a variable
			VariableData *functPtr = AllocateTemporary(ctx, sourceInternal, value->type);

			ExprBase *funcPtrInitializer = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, functPtr, false), value);

			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, functPtr), funcPtrInitializer));

			if(ExprFunctionAccess *access = getType<ExprFunctionAccess>(value))
			{
				if(!access->function->coroutine)
					Stop(ctx, curr, "ERROR: function is not a coroutine");
			}
			else
			{
				initializers.push_back(CreateFunctionCall1(ctx, sourceInternal, InplaceStr("__assertCoroutine"), CreateVariableAccess(ctx, sourceInternal, functPtr, false), false, true, true));
			}

			// Create definition
			if(!type || type == ctx.typeAuto)
			{
				if(functionType->returnType == ctx.typeAuto)
				{
					Report(ctx, curr, "ERROR: function type is unresolved at this point");

					continue;
				}

				type = functionType->returnType;
			}

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			if(ExprBase *call = CreateFunctionCall(ctx, curr, CreateVariableAccess(ctx, sourceInternal, functPtr, false), IntrusiveList<TypeHandle>(), NULL, false))
			{
				if(ctx.GetReferenceType(type) == call->type)
					call = new (ctx.get<ExprDereference>()) ExprDereference(curr, type, call);

				initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), call)));
			}

			// Create condition
			conditions.push_back(new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(curr, ctx.typeBool, SYN_UNARY_OP_LOGICAL_NOT, CreateFunctionCall1(ctx, curr, InplaceStr("isCoroutineReset"), CreateVariableAccess(ctx, sourceInternal, functPtr, false), false, false, true)));

			// Create increment
			if(ExprBase *call = CreateFunctionCall(ctx, curr, CreateVariableAccess(ctx, sourceInternal, functPtr, false), IntrusiveList<TypeHandle>(), NULL, false))
			{
				if(ctx.GetReferenceType(type) == call->type)
					call = new (ctx.get<ExprDereference>()) ExprDereference(curr, type, call);

				increments.push_back(CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), call));
			}
		}
		else
		{
			// Store iterator in a variable
			VariableData *iterator = AllocateTemporary(ctx, sourceInternal, startCall->type);

			ExprBase *iteratorInitializer = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), startCall);
			
			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, iterator), iteratorInitializer));

			// Create condition
			conditions.push_back(CreateFunctionCall(ctx, curr, CreateMemberAccess(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("hasnext")), false), IntrusiveList<TypeHandle>(), NULL, false));

			// Create definition
			ExprBase *call = CreateFunctionCall(ctx, curr, CreateMemberAccess(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("next")), false), IntrusiveList<TypeHandle>(), NULL, false);

			if(!type || type == ctx.typeAuto)
				type = call->type;
			else
				type = ctx.GetReferenceType(type);

			if(isType<TypeError>(type))
				continue;

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			variable->isReference = isType<TypeRef>(type);

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			definitions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, variable, false), call)));
		}
	}

	for(unsigned i = 0; i < iterators.size(); i++)
		ctx.AddVariable(iterators[i], true);

	ExprBase *initializer = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, initializers, NULL);

	ExprBase *condition = NULL;

	for(ExprBase *curr = conditions.head; curr; curr = curr->next)
	{
		if(!condition)
			condition = curr;
		else
			condition = CreateBinaryOp(ctx, syntax, SYN_BINARY_OP_LOGICAL_AND, condition, curr);
	}

	ExprBase *increment = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, increments, NULL);

	if(syntax->body)
		definitions.push_back(AnalyzeStatement(ctx, syntax->body));

	ExprBase *body = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, definitions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprFor>()) ExprFor(syntax, ctx.typeVoid, initializer, condition, increment, body);
}